

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int * Cudd_SupportIndex(DdManager *dd,DdNode *f)

{
  int *support;
  uint uVar1;
  
  uVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar1 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar1 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (0 < (int)uVar1) {
      memset(support,0,(ulong)uVar1 << 2);
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  }
  return support;
}

Assistant:

int *
Cudd_SupportIndex(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support is sought */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}